

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void spill_restore_reg(gen_ctx_t gen_ctx,MIR_reg_t reg,MIR_reg_t base_reg,MIR_insn_t anchor,
                      int after_p,int restore_p)

{
  ra_ctx *prVar1;
  VARR_MIR_reg_t *pVVar2;
  VARR_spill_cache_el_t *pVVar3;
  spill_cache_el_t *psVar4;
  bitmap_t pVVar5;
  bitmap_t *ppVVar6;
  VARR_live_range_t *pVVar7;
  void *pvVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  MIR_type_t MVar12;
  int iVar13;
  int iVar14;
  live_range_t_conflict plVar15;
  MIR_reg_t MVar16;
  int iVar17;
  undefined8 uVar18;
  int extraout_EDX;
  char *pcVar19;
  MIR_context_t bm;
  uint uVar20;
  long lVar21;
  int iVar22;
  undefined4 in_register_00000034;
  VARR_bitmap_t *pVVar23;
  size_t nb;
  MIR_context_t pMVar24;
  MIR_context_t pMVar25;
  MIR_op_mode_t data_mode;
  long lVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  MIR_reg_t local_b0;
  MIR_op_t mem_op;
  
  uVar18 = CONCAT44(in_register_00000034,reg);
  pMVar24 = gen_ctx->ctx;
  MVar12 = MIR_reg_type(pMVar24,reg - 0x21,(gen_ctx->curr_func_item->u).func);
  if (MVar12 == MIR_T_F) {
    data_mode = MIR_OP_FLOAT;
  }
  else if (MVar12 == MIR_T_D) {
    data_mode = MIR_OP_DOUBLE;
  }
  else {
    data_mode = (uint)(MVar12 == MIR_T_LD) * 4 + MIR_OP_INT;
  }
  prVar1 = gen_ctx->ra_ctx;
  pVVar2 = prVar1->reg_renumber;
  if (((pVVar2 == (VARR_MIR_reg_t *)0x0) || (pVVar2->varr == (MIR_reg_t *)0x0)) ||
     (uVar29 = (ulong)reg, pVVar2->els_num <= uVar29)) {
LAB_0017022a:
    spill_restore_reg_cold_7();
LAB_0017022f:
    __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
  }
  uVar28 = pVVar2->varr[uVar29];
  if (0x21 < uVar28) {
LAB_00170258:
    __assert_fail("hard_reg <= ST1_HARD_REG",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1eb0,
                  "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)");
  }
  pVVar23 = prVar1->used_locs;
  if (pVVar23 == (VARR_bitmap_t *)0x0) {
    spill_restore_reg_cold_6();
LAB_0017027c:
    spill_restore_reg_cold_5();
  }
  else {
    pVVar3 = prVar1->spill_cache;
    if (pVVar3 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
    if ((reg == 0xffffffff) || (pVVar3->els_num <= uVar29)) goto LAB_0017022f;
    psVar4 = pVVar3->varr;
    if (psVar4[uVar29].age == prVar1->spill_cache_age) {
      local_b0 = psVar4[uVar29].slot;
LAB_0017019a:
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcVar19 = "Restore";
        if (restore_p == 0) {
          pcVar19 = "Spill";
        }
        fprintf((FILE *)gen_ctx->debug_file,"    %s r%d:",pcVar19,uVar18);
      }
      add_ld_st(gen_ctx,&mem_op,local_b0,base_reg,data_mode,uVar28,(uint)(restore_p == 0),10,anchor,
                after_p);
      return;
    }
    pVVar5 = prVar1->conflict_locs1;
    if ((pVVar5 != (bitmap_t)0x0) && (pVVar5->varr != (bitmap_el_t *)0x0)) {
      ppVVar6 = pVVar23->varr;
      pMVar24 = gen_ctx->ctx;
      pVVar5->els_num = 0;
      pVVar7 = gen_ctx->lr_ctx->var_live_ranges;
      if ((pVVar7 == (VARR_live_range_t *)0x0) ||
         ((pVVar7->varr == (live_range_t_conflict *)0x0 || (pVVar7->els_num <= uVar29)))) {
        spill_restore_reg_cold_3();
      }
      else {
        for (plVar15 = pVVar7->varr[uVar29]; plVar15 != (live_range_t_conflict)0x0;
            plVar15 = plVar15->next) {
          if (plVar15->start <= plVar15->finish) {
            lVar21 = (long)plVar15->start + -1;
            do {
              bitmap_ior(pVVar5,pVVar5,ppVVar6[lVar21 + 1]);
              lVar21 = lVar21 + 1;
            } while (lVar21 < plVar15->finish);
          }
        }
        MVar12 = MIR_reg_type(pMVar24,reg - 0x21,(gen_ctx->curr_func_item->u).func);
        local_b0 = get_stack_loc(gen_ctx,gen_ctx->ra_ctx->start_mem_loc,MVar12,pVVar5,(int *)&mem_op
                                );
        psVar4[uVar29].slot = local_b0;
        psVar4[uVar29].age = gen_ctx->ra_ctx->spill_cache_age;
        pVVar7 = gen_ctx->lr_ctx->var_live_ranges;
        if (((pVVar7 != (VARR_live_range_t *)0x0) && (pVVar7->varr != (live_range_t_conflict *)0x0))
           && (uVar29 < pVVar7->els_num)) {
          plVar15 = pVVar7->varr[uVar29];
          if (plVar15 != (live_range_t_conflict)0x0) {
            do {
              iVar13 = plVar15->finish;
              lVar21 = (long)plVar15->start;
              if (plVar15->start <= iVar13) {
                do {
                  uVar29 = (ulong)(uint)mem_op.data;
                  MVar16 = local_b0;
                  if (0 < (int)(uint)mem_op.data) {
                    do {
                      pVVar5 = ppVVar6[lVar21];
                      bitmap_expand(pVVar5,(ulong)MVar16 + 1);
                      if (pVVar5 == (bitmap_t)0x0) {
                        spill_restore_reg_cold_1();
                        goto LAB_0017022a;
                      }
                      pVVar5->varr[MVar16 >> 6] =
                           pVVar5->varr[MVar16 >> 6] | 1L << ((ulong)MVar16 & 0x3f);
                      MVar16 = MVar16 + 1;
                      uVar29 = uVar29 - 1;
                    } while (uVar29 != 0);
                    iVar13 = plVar15->finish;
                  }
                  bVar9 = lVar21 < iVar13;
                  lVar21 = lVar21 + 1;
                } while (bVar9);
              }
              plVar15 = plVar15->next;
            } while (plVar15 != (live_range_t)0x0);
          }
          goto LAB_0017019a;
        }
      }
      spill_restore_reg_cold_2();
      goto LAB_00170258;
    }
  }
  iVar22 = (int)pVVar23;
  iVar13 = (int)uVar18;
  spill_restore_reg_cold_4();
  uVar29 = (ulong)pMVar24 & 0xffffffff;
  if (iVar22 == 0) {
    nb = uVar29 + 1;
    pMVar25 = bm;
    bitmap_expand((bitmap_t)bm,nb);
    iVar22 = (int)nb;
    if (bm == (MIR_context_t)0x0) goto LAB_001702f4;
    *(ulong *)(bm->error_func + (uVar29 >> 6) * 8) =
         *(ulong *)(bm->error_func + (uVar29 >> 6) * 8) | 1L << ((ulong)pMVar24 & 0x3f);
  }
  else {
    if (bm == (MIR_context_t)0x0) {
      update_live_cold_1();
      pMVar25 = pMVar24;
LAB_001702f4:
      update_live_cold_2();
      pvVar8 = pMVar25[1].environment_module.data;
      lVar21 = 0x1e8;
      uVar29 = (ulong)(iVar13 != 0);
      if (iVar13 == 0) {
        lVar21 = 0x188;
      }
      iVar13 = *(int *)((long)pvVar8 + uVar29 * 4 + 0x180);
      lVar26 = (long)iVar13;
      if (lVar26 < 1) {
        uVar28 = 0;
      }
      else {
        uVar20 = extraout_EDX - 8;
        lVar27 = 0;
        uVar28 = 0;
        do {
          if ((iVar22 != -1) && (*(int *)((long)pvVar8 + lVar27 + lVar21 + 4) == iVar22)) {
            return;
          }
          iVar14 = *(int *)((long)pvVar8 + lVar27 + lVar21 + 8);
          if (uVar28 == 0) {
            iVar17 = 10;
            if (uVar20 < 3) {
              iVar17 = *(int *)(&DAT_001b1a90 + (ulong)uVar20 * 4);
            }
            uVar11 = 1;
            if (iVar14 != iVar17) goto LAB_00170398;
          }
          else {
LAB_00170398:
            iVar17 = 0xb;
            if (uVar20 < 3) {
              iVar17 = *(int *)(&DAT_001b1a9c + (ulong)uVar20 * 4);
            }
            uVar11 = uVar28;
            if (iVar14 == iVar17) {
              uVar11 = 2;
            }
          }
          uVar28 = uVar11;
          lVar27 = lVar27 + 0xc;
        } while (lVar26 * 0xc != lVar27);
        if (1 < uVar28) {
          __assert_fail("rld_num <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
        }
      }
      if (extraout_EDX == 10) {
        iVar14 = -1;
      }
      else {
        if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
          iVar14 = 0x19;
        }
        else {
          iVar14 = 0xb;
        }
        iVar14 = iVar14 - (uint)(uVar28 == 0);
      }
      *(int *)((long)pvVar8 + uVar29 * 4 + 0x180) = iVar13 + 1;
      if (iVar13 < 8) {
        *(int *)((long)pvVar8 + lVar26 * 0xc + lVar21 + 4) = iVar22;
        *(int *)((long)pvVar8 + lVar26 * 0xc + lVar21) = extraout_EDX;
        *(int *)((long)pvVar8 + lVar26 * 0xc + lVar21 + 8) = iVar14;
        return;
      }
      __assert_fail("rld_num < (2 * 4)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
    if (uVar29 < (ulong)((long)bm->gen_ctx << 6)) {
      bVar10 = (byte)uVar29 & 0x3f;
      *(ulong *)(bm->error_func + (uVar29 >> 6) * 8) =
           *(ulong *)(bm->error_func + (uVar29 >> 6) * 8) &
           (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
    }
  }
  return;
}

Assistant:

static void spill_restore_reg (gen_ctx_t gen_ctx, MIR_reg_t reg, MIR_reg_t base_reg,
                               MIR_insn_t anchor, int after_p, int restore_p) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_reg_t mem_loc;
  MIR_op_t mem_op;
  MIR_type_t type = MIR_reg_type (ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
  MIR_op_mode_t data_mode = type2mode (type);
  MIR_reg_t hard_reg = VARR_GET (MIR_reg_t, reg_renumber, reg);
  gen_assert (hard_reg <= MAX_HARD_REG);
  mem_loc = get_spill_mem_loc (gen_ctx, reg);
  DEBUG (2, { fprintf (debug_file, "    %s r%d:", restore_p ? "Restore" : "Spill", reg); });
  add_ld_st (gen_ctx, &mem_op, mem_loc, base_reg, data_mode, hard_reg, !restore_p,
             TEMP_INT_HARD_REG1, anchor, after_p);
}